

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong *puVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  ulong *puVar23;
  byte bVar24;
  ulong uVar25;
  byte bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  vint4 bi;
  vint4 bi_1;
  vint4 ai;
  ulong local_800;
  size_t local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = root.ptr;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar42._4_4_ = fVar1;
  auVar42._0_4_ = fVar1;
  auVar42._8_4_ = fVar1;
  auVar42._12_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar43._4_4_ = fVar2;
  auVar43._0_4_ = fVar2;
  auVar43._8_4_ = fVar2;
  auVar43._12_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar44._4_4_ = fVar3;
  auVar44._0_4_ = fVar3;
  auVar44._8_4_ = fVar3;
  auVar44._12_4_ = fVar3;
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar16 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar45._8_4_ = 0x80000000;
  auVar45._0_8_ = 0x8000000080000000;
  auVar45._12_4_ = 0x80000000;
  auVar46._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  auVar46._8_4_ = -fVar1;
  auVar46._12_4_ = -fVar1;
  auVar47._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar47._8_4_ = -fVar2;
  auVar47._12_4_ = -fVar2;
  auVar48._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar48._8_4_ = -fVar3;
  auVar48._12_4_ = -fVar3;
  iVar4 = (tray->tnear).field_0.i[k];
  auVar49._4_4_ = iVar4;
  auVar49._0_4_ = iVar4;
  auVar49._8_4_ = iVar4;
  auVar49._12_4_ = iVar4;
  iVar4 = (tray->tfar).field_0.i[k];
  auVar50._4_4_ = iVar4;
  auVar50._0_4_ = iVar4;
  auVar50._8_4_ = iVar4;
  auVar50._12_4_ = iVar4;
  auVar51._8_4_ = 0x7fffffff;
  auVar51._0_8_ = 0x7fffffff7fffffff;
  auVar51._12_4_ = 0x7fffffff;
  auVar52 = ZEXT816(0) << 0x40;
  puVar23 = local_7d0;
LAB_01cb0bd4:
  do {
    puVar18 = puVar23;
    if (puVar18 == &local_7d8) {
LAB_01cb0f06:
      return puVar18 != &local_7d8;
    }
    puVar23 = puVar18 + -1;
    uVar21 = puVar18[-1];
    while ((uVar21 & 8) == 0) {
      auVar39 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + uVar16),auVar46,auVar42);
      auVar41 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + uVar19),auVar47,auVar43);
      auVar39 = vpmaxsd_avx(auVar39,auVar41);
      auVar41 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + uVar20),auVar48,auVar44);
      auVar41 = vpmaxsd_avx(auVar41,auVar49);
      auVar39 = vpmaxsd_avx(auVar39,auVar41);
      auVar41 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + (uVar16 ^ 0x10)),auVar46,
                                auVar42);
      auVar40 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + (uVar19 ^ 0x10)),auVar47,
                                auVar43);
      auVar41 = vpminsd_avx(auVar41,auVar40);
      auVar40 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + (uVar20 ^ 0x10)),auVar48,
                                auVar44);
      auVar40 = vpminsd_avx(auVar40,auVar50);
      auVar41 = vpminsd_avx(auVar41,auVar40);
      uVar25 = vpcmpd_avx512vl(auVar39,auVar41,2);
      uVar25 = uVar25 & 0xf;
      if ((char)uVar25 == '\0') goto LAB_01cb0bd4;
      uVar14 = uVar21 & 0xfffffffffffffff0;
      lVar17 = 0;
      for (uVar21 = uVar25; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
        lVar17 = lVar17 + 1;
      }
      uVar21 = *(ulong *)(uVar14 + lVar17 * 8);
      uVar22 = (uint)uVar25 - 1 & (uint)uVar25;
      uVar25 = (ulong)uVar22;
      if (uVar22 != 0) {
        do {
          *puVar23 = uVar21;
          puVar23 = puVar23 + 1;
          lVar17 = 0;
          for (uVar21 = uVar25; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
            lVar17 = lVar17 + 1;
          }
          uVar25 = uVar25 - 1 & uVar25;
          uVar21 = *(ulong *)(uVar14 + lVar17 * 8);
        } while (uVar25 != 0);
      }
    }
    uVar25 = uVar21 & 0xfffffffffffffff0;
    for (lVar17 = 0; lVar17 != (ulong)((uint)uVar21 & 0xf) - 8; lVar17 = lVar17 + 1) {
      lVar15 = lVar17 * 0xb0;
      auVar39 = *(undefined1 (*) [16])(uVar25 + 0x80 + lVar15);
      auVar41 = *(undefined1 (*) [16])(uVar25 + 0x40 + lVar15);
      auVar40 = *(undefined1 (*) [16])(uVar25 + 0x70 + lVar15);
      auVar6 = *(undefined1 (*) [16])(uVar25 + 0x50 + lVar15);
      auVar27 = vmulps_avx512vl(auVar41,auVar39);
      auVar7 = *(undefined1 (*) [16])(uVar25 + 0x60 + lVar15);
      auVar8 = *(undefined1 (*) [16])(uVar25 + 0x30 + lVar15);
      auVar28 = vfmsub231ps_avx512vl(auVar27,auVar40,auVar6);
      auVar27 = vmulps_avx512vl(auVar6,auVar7);
      auVar29 = vfmsub231ps_avx512vl(auVar27,auVar39,auVar8);
      auVar30 = vmulps_avx512vl(auVar8,auVar40);
      auVar31 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
      auVar32 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
      auVar33 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
      uVar5 = *(undefined4 *)(ray + k * 4);
      auVar27._4_4_ = uVar5;
      auVar27._0_4_ = uVar5;
      auVar27._8_4_ = uVar5;
      auVar27._12_4_ = uVar5;
      auVar27 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar25 + lVar15),auVar27);
      auVar34 = vfmsub231ps_avx512vl(auVar30,auVar7,auVar41);
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar30._4_4_ = uVar5;
      auVar30._0_4_ = uVar5;
      auVar30._8_4_ = uVar5;
      auVar30._12_4_ = uVar5;
      auVar30 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar25 + 0x10 + lVar15),auVar30);
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar35._4_4_ = uVar5;
      auVar35._0_4_ = uVar5;
      auVar35._8_4_ = uVar5;
      auVar35._12_4_ = uVar5;
      auVar35 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar25 + 0x20 + lVar15),auVar35);
      auVar36 = vmulps_avx512vl(auVar32,auVar35);
      auVar36 = vfmsub231ps_avx512vl(auVar36,auVar30,auVar33);
      auVar37 = vmulps_avx512vl(auVar33,auVar27);
      auVar37 = vfmsub231ps_avx512vl(auVar37,auVar35,auVar31);
      auVar38 = vmulps_avx512vl(auVar31,auVar30);
      auVar38 = vfmsub231ps_avx512vl(auVar38,auVar27,auVar32);
      auVar33 = vmulps_avx512vl(auVar34,auVar33);
      auVar32 = vfmadd231ps_avx512vl(auVar33,auVar29,auVar32);
      auVar31 = vfmadd231ps_avx512vl(auVar32,auVar28,auVar31);
      auVar32 = vandps_avx512vl(auVar31,auVar51);
      auVar33 = vandps_avx512vl(auVar31,auVar45);
      auVar39 = vmulps_avx512vl(auVar39,auVar38);
      auVar39 = vfmadd231ps_avx512vl(auVar39,auVar37,auVar40);
      auVar39 = vfmadd231ps_avx512vl(auVar39,auVar36,auVar7);
      auVar39 = vxorps_avx512vl(auVar33,auVar39);
      auVar40 = vmulps_avx512vl(auVar6,auVar38);
      auVar41 = vfmadd231ps_avx512vl(auVar40,auVar41,auVar37);
      auVar41 = vfmadd231ps_avx512vl(auVar41,auVar8,auVar36);
      auVar41 = vxorps_avx512vl(auVar33,auVar41);
      uVar9 = vcmpps_avx512vl(auVar39,auVar52,5);
      uVar10 = vcmpps_avx512vl(auVar41,auVar52,5);
      uVar11 = vcmpps_avx512vl(auVar31,auVar52,4);
      auVar39 = vaddps_avx512vl(auVar39,auVar41);
      uVar12 = vcmpps_avx512vl(auVar39,auVar32,2);
      bVar24 = (byte)uVar9 & (byte)uVar10 & (byte)uVar11 & (byte)uVar12;
      if (bVar24 != 0) {
        auVar39 = vmulps_avx512vl(auVar34,auVar35);
        auVar39 = vfmadd213ps_fma(auVar30,auVar29,auVar39);
        auVar39 = vfmadd213ps_fma(auVar27,auVar28,auVar39);
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar41._4_4_ = uVar5;
        auVar41._0_4_ = uVar5;
        auVar41._8_4_ = uVar5;
        auVar41._12_4_ = uVar5;
        auVar41 = vmulps_avx512vl(auVar32,auVar41);
        auVar40 = vxorps_avx512vl(auVar33,auVar39);
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar39._4_4_ = uVar5;
        auVar39._0_4_ = uVar5;
        auVar39._8_4_ = uVar5;
        auVar39._12_4_ = uVar5;
        auVar39 = vmulps_avx512vl(auVar32,auVar39);
        uVar9 = vcmpps_avx512vl(auVar40,auVar39,2);
        uVar10 = vcmpps_avx512vl(auVar41,auVar40,1);
        bVar26 = (byte)uVar9 & (byte)uVar10;
        if ((bVar26 & bVar24) != 0) {
          local_800 = (ulong)(bVar26 & bVar24);
          do {
            uVar14 = 0;
            for (uVar13 = local_800; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
              uVar14 = uVar14 + 1;
            }
            if ((((context->scene->geometries).items[*(uint *)(lVar15 + uVar25 + 0x90 + uVar14 * 4)]
                 .ptr)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
              goto LAB_01cb0f06;
            }
            local_800 = local_800 ^ 1L << (uVar14 & 0x3f);
          } while (local_800 != 0);
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }